

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2.c
# Opt level: O2

xmlNodePtr xmlSAX2TextNode(xmlParserCtxtPtr ctxt,xmlChar *str,int len)

{
  xmlChar xVar1;
  byte bVar2;
  int i;
  xmlNodePtr pxVar3;
  xmlChar *pxVar4;
  xmlRegisterNodeFunc *pp_Var5;
  long lVar6;
  _xmlAttr **__dest;
  size_t __n;
  
  pxVar3 = ctxt->freeElems;
  if (pxVar3 == (xmlNodePtr)0x0) {
    pxVar3 = (xmlNodePtr)(*xmlMalloc)(0x78);
    if (pxVar3 != (xmlNodePtr)0x0) goto LAB_00144426;
    xmlCtxtErrMemory(ctxt);
LAB_001445d7:
    pxVar3 = (xmlNodePtr)0x0;
  }
  else {
    ctxt->freeElems = pxVar3->next;
    ctxt->freeElemsNr = ctxt->freeElemsNr + -1;
LAB_00144426:
    pxVar3->nsDef = (xmlNs *)0x0;
    pxVar3->psvi = (void *)0x0;
    pxVar3->content = (xmlChar *)0x0;
    pxVar3->properties = (_xmlAttr *)0x0;
    pxVar3->doc = (_xmlDoc *)0x0;
    pxVar3->ns = (xmlNs *)0x0;
    pxVar3->next = (_xmlNode *)0x0;
    pxVar3->prev = (_xmlNode *)0x0;
    pxVar3->last = (_xmlNode *)0x0;
    pxVar3->parent = (_xmlNode *)0x0;
    pxVar3->line = 0;
    pxVar3->extra = 0;
    *(undefined4 *)&pxVar3->field_0x74 = 0;
    pxVar3->name = (xmlChar *)0x0;
    pxVar3->children = (_xmlNode *)0x0;
    pxVar3->_private = (void *)0x0;
    *(undefined8 *)&pxVar3->type = 0;
    if ((ctxt->html != 0) || (ctxt->dictNames == 0)) goto LAB_00144450;
    __n = (size_t)len;
    xVar1 = str[__n];
    if (len < 0x10) {
      if ((ctxt->options & 0x10000) == 0) {
        if ((3 < len) ||
           (((xVar1 != '\"' && (xVar1 != '\'')) && ((xVar1 != '<' || (str[__n + 1] == '!'))))))
        goto LAB_001444ee;
LAB_0014458f:
        __dest = (_xmlAttr **)xmlDictLookup(ctxt->dict,str,len);
        if (__dest == (_xmlAttr **)0x0) goto LAB_001445c3;
      }
      else {
        __dest = &pxVar3->properties;
        memcpy(__dest,str,__n);
        *(undefined1 *)((long)&pxVar3->properties + __n) = 0;
      }
      pxVar3->type = XML_TEXT_NODE;
      pxVar3->name = "text";
      pxVar3->content = (xmlChar *)__dest;
    }
    else {
LAB_001444ee:
      bVar2 = *str;
      if (((ulong)bVar2 < 0x21) && ((0x100000600U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) {
        if (len < 0x3c) {
LAB_0014454b:
          if ((xVar1 == '<') && (str[__n + 1] != '!')) {
            for (lVar6 = 1; lVar6 < (long)__n; lVar6 = lVar6 + 1) {
              if ((0x20 < (ulong)str[lVar6]) ||
                 ((0x100002600U >> ((ulong)str[lVar6] & 0x3f) & 1) == 0)) goto LAB_00144450;
            }
            goto LAB_0014458f;
          }
        }
      }
      else if ((len < 0x3c) && (bVar2 == 0xd)) goto LAB_0014454b;
LAB_00144450:
      pxVar3->type = XML_TEXT_NODE;
      pxVar3->name = "text";
      pxVar4 = xmlStrndup(str,len);
      pxVar3->content = pxVar4;
      if (pxVar4 == (xmlChar *)0x0) {
LAB_001445c3:
        xmlCtxtErrMemory(ctxt);
        (*xmlFree)(pxVar3);
        goto LAB_001445d7;
      }
    }
    if ((xmlRegisterCallbacks != 0) &&
       (pp_Var5 = __xmlRegisterNodeDefaultValue(), *pp_Var5 != (xmlRegisterNodeFunc)0x0)) {
      pp_Var5 = __xmlRegisterNodeDefaultValue();
      (**pp_Var5)(pxVar3);
    }
  }
  return pxVar3;
}

Assistant:

static xmlNodePtr
xmlSAX2TextNode(xmlParserCtxtPtr ctxt, const xmlChar *str, int len) {
    xmlNodePtr ret;
    const xmlChar *intern = NULL;

    /*
     * Allocate
     */
    if (ctxt->freeElems != NULL) {
	ret = ctxt->freeElems;
	ctxt->freeElems = ret->next;
	ctxt->freeElemsNr--;
    } else {
	ret = (xmlNodePtr) xmlMalloc(sizeof(xmlNode));
    }
    if (ret == NULL) {
        xmlCtxtErrMemory(ctxt);
	return(NULL);
    }
    memset(ret, 0, sizeof(xmlNode));
    /*
     * intern the formatting blanks found between tags, or the
     * very short strings
     */
    if ((!ctxt->html) && (ctxt->dictNames)) {
        xmlChar cur = str[len];

	if ((len < (int) (2 * sizeof(void *))) &&
	    (ctxt->options & XML_PARSE_COMPACT)) {
	    /* store the string in the node overriding properties and nsDef */
	    xmlChar *tmp = (xmlChar *) &(ret->properties);
	    memcpy(tmp, str, len);
	    tmp[len] = 0;
	    intern = tmp;
	} else if ((len <= 3) && ((cur == '"') || (cur == '\'') ||
	    ((cur == '<') && (str[len + 1] != '!')))) {
	    intern = xmlDictLookup(ctxt->dict, str, len);
            if (intern == NULL) {
                xmlSAX2ErrMemory(ctxt);
                xmlFree(ret);
                return(NULL);
            }
	} else if (IS_BLANK_CH(*str) && (len < 60) && (cur == '<') &&
	           (str[len + 1] != '!')) {
	    int i;

	    for (i = 1;i < len;i++) {
		if (!IS_BLANK_CH(str[i])) goto skip;
	    }
	    intern = xmlDictLookup(ctxt->dict, str, len);
            if (intern == NULL) {
                xmlSAX2ErrMemory(ctxt);
                xmlFree(ret);
                return(NULL);
            }
	}
    }
skip:
    ret->type = XML_TEXT_NODE;

    ret->name = xmlStringText;
    if (intern == NULL) {
	ret->content = xmlStrndup(str, len);
	if (ret->content == NULL) {
	    xmlSAX2ErrMemory(ctxt);
	    xmlFree(ret);
	    return(NULL);
	}
    } else
	ret->content = (xmlChar *) intern;

    if ((xmlRegisterCallbacks) && (xmlRegisterNodeDefaultValue))
	xmlRegisterNodeDefaultValue(ret);
    return(ret);
}